

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_Oneof_Test::TestBody
          (GeneratedMessageReflectionTest_Oneof_Test *this)

{
  int32_t iVar1;
  Descriptor *this_00;
  FieldDescriptor *pFVar2;
  EnumValueDescriptor *pEVar3;
  Reflection *this_01;
  char *pcVar4;
  Metadata MVar5;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  string_view name_24;
  string_view name_25;
  string_view name_26;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TestOneof2 message;
  AssertHelper local_140;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  TestOneof2 local_108;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  proto2_unittest::TestOneof2::TestOneof2(&local_108,(Arena *)0x0);
  MVar5 = proto2_unittest::TestOneof2::GetMetadata
                    ((TestOneof2 *)proto2_unittest::_TestOneof2_default_instance_);
  this_00 = MVar5.descriptor;
  MVar5 = proto2_unittest::TestOneof2::GetMetadata
                    ((TestOneof2 *)proto2_unittest::_TestOneof2_default_instance_);
  this_01 = MVar5.reflection;
  local_138._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_138._M_head_impl._4_4_ << 0x20);
  name._M_str = "foo_int";
  name._M_len = 7;
  pFVar2 = Descriptor::FindFieldByName(this_00,name);
  local_140.data_._0_4_ = Reflection::GetInt32(this_01,&local_108.super_Message,pFVar2);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_128,"0",
             "reflection->GetInt32(message, descriptor->FindFieldByName(\"foo_int\"))",
             (int *)&local_138,(int *)&local_140);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x44f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138._M_head_impl + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  name_00._M_str = "foo_string";
  name_00._M_len = 10;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_00);
  Reflection::GetString_abi_cxx11_((string *)local_128,this_01,&local_108.super_Message,pFVar2);
  pcVar4 = anon_var_dwarf_a12c75 + 5;
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_138,"\"\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"foo_string\"))",
             (char (*) [1])(anon_var_dwarf_a12c75 + 5),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1);
  }
  if (local_138._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x451,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  name_01._M_str = "foo_cord";
  name_01._M_len = 8;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_01);
  Reflection::GetString_abi_cxx11_((string *)local_128,this_01,&local_108.super_Message,pFVar2);
  pcVar4 = anon_var_dwarf_a12c75 + 5;
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_138,"\"\"",
             "reflection->GetString(message, descriptor->FindFieldByName(\"foo_cord\"))",
             (char (*) [1])(anon_var_dwarf_a12c75 + 5),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1);
  }
  if (local_138._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x453,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  name_02._M_str = "foo_string_piece";
  name_02._M_len = 0x10;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_02);
  Reflection::GetString_abi_cxx11_((string *)local_128,this_01,&local_108.super_Message,pFVar2);
  pcVar4 = anon_var_dwarf_a12c75 + 5;
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_138,"\"\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"foo_string_piece\"))",
             (char (*) [1])(anon_var_dwarf_a12c75 + 5),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1);
  }
  if (local_138._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x455,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  name_03._M_str = "foo_bytes";
  name_03._M_len = 9;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_03);
  Reflection::GetString_abi_cxx11_((string *)local_128,this_01,&local_108.super_Message,pFVar2);
  pcVar4 = anon_var_dwarf_a12c75 + 5;
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_138,"\"\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"foo_bytes\"))",
             (char (*) [1])(anon_var_dwarf_a12c75 + 5),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1);
  }
  if (local_138._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x457,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  name_04._M_str = "foo_enum";
  name_04._M_len = 8;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_04);
  pEVar3 = Reflection::GetEnum(this_01,&local_108.super_Message,pFVar2);
  local_138._M_head_impl._0_4_ = pEVar3->number_;
  testing::internal::CmpHelperEQ<proto2_unittest::TestOneof2_NestedEnum,int>
            ((internal *)local_128,"unittest::TestOneof2::FOO",
             "reflection->GetEnum(message, descriptor->FindFieldByName(\"foo_enum\")) ->number()",
             &proto2_unittest::TestOneof2::FOO,(int *)&local_138);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x45b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138._M_head_impl + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  local_138._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &proto2_unittest::_TestOneof2_NestedMessage_default_instance_;
  name_05._M_str = "foo_message";
  name_05._M_len = 0xb;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_05);
  local_140.data_ =
       (AssertHelperData *)
       Reflection::GetMessage(this_01,&local_108.super_Message,pFVar2,(MessageFactory *)0x0);
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestOneof2_NestedMessage_const*,google::protobuf::Message_const*>
            ((internal *)local_128,"&unittest::TestOneof2::NestedMessage::default_instance()",
             "&reflection->GetMessage( message, descriptor->FindFieldByName(\"foo_message\"))",
             (TestOneof2_NestedMessage **)&local_138,(Message **)&local_140);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x45e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138._M_head_impl + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  local_138._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &proto2_unittest::_TestOneof2_FooGroup_default_instance_;
  name_06._M_str = "foogroup";
  name_06._M_len = 8;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_06);
  local_140.data_ =
       (AssertHelperData *)
       Reflection::GetMessage(this_01,&local_108.super_Message,pFVar2,(MessageFactory *)0x0);
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestOneof2_FooGroup_const*,google::protobuf::Message_const*>
            ((internal *)local_128,"&unittest::TestOneof2::FooGroup::default_instance()",
             "&reflection->GetMessage(message, descriptor->FindFieldByName(\"foogroup\"))",
             (TestOneof2_FooGroup **)&local_138,(Message **)&local_140);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x461,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138._M_head_impl + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  local_138._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &proto2_unittest::_TestOneof2_FooGroup_default_instance_;
  name_07._M_str = "foo_lazy_message";
  name_07._M_len = 0x10;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_07);
  local_140.data_ =
       (AssertHelperData *)
       Reflection::GetMessage(this_01,&local_108.super_Message,pFVar2,(MessageFactory *)0x0);
  testing::internal::
  CmpHelperNE<proto2_unittest::TestOneof2_FooGroup_const*,google::protobuf::Message_const*>
            ((internal *)local_128,"&unittest::TestOneof2::FooGroup::default_instance()",
             "&reflection->GetMessage( message, descriptor->FindFieldByName(\"foo_lazy_message\"))",
             (TestOneof2_FooGroup **)&local_138,(Message **)&local_140);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x464,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138._M_head_impl + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  name_08._M_str = "foo_bytes_cord";
  name_08._M_len = 0xe;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_08);
  Reflection::GetString_abi_cxx11_((string *)local_128,this_01,&local_108.super_Message,pFVar2);
  pcVar4 = anon_var_dwarf_a12c75 + 5;
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_138,"\"\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"foo_bytes_cord\"))",
             (char (*) [1])(anon_var_dwarf_a12c75 + 5),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1);
  }
  if (local_138._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x466,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_138._M_head_impl._0_4_ = 5;
  name_09._M_str = "bar_int";
  name_09._M_len = 7;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_09);
  iVar1 = Reflection::GetInt32(this_01,&local_108.super_Message,pFVar2);
  local_140.data_._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_128,"5",
             "reflection->GetInt32(message, descriptor->FindFieldByName(\"bar_int\"))",
             (int *)&local_138,(int *)&local_140);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x468,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138._M_head_impl + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  name_10._M_str = "bar_string";
  name_10._M_len = 10;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_10);
  Reflection::GetString_abi_cxx11_((string *)local_128,this_01,&local_108.super_Message,pFVar2);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_138,"\"STRING\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"bar_string\"))",
             (char (*) [7])0x10e43d1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1);
  }
  if (local_138._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x46a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  name_11._M_str = "bar_cord";
  name_11._M_len = 8;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_11);
  Reflection::GetString_abi_cxx11_((string *)local_128,this_01,&local_108.super_Message,pFVar2);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_138,"\"CORD\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"bar_cord\"))",
             (char (*) [5])0x10e2c3d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1);
  }
  if (local_138._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x46c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  name_12._M_str = "bar_string_piece";
  name_12._M_len = 0x10;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_12);
  Reflection::GetString_abi_cxx11_((string *)local_128,this_01,&local_108.super_Message,pFVar2);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_138,"\"SPIECE\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"bar_string_piece\"))",
             (char (*) [7])"SPIECE",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1);
  }
  if (local_138._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x46f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  name_13._M_str = "bar_bytes";
  name_13._M_len = 9;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_13);
  Reflection::GetString_abi_cxx11_((string *)local_128,this_01,&local_108.super_Message,pFVar2);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_138,"\"BYTES\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"bar_bytes\"))",
             (char (*) [6])0x1441953,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1);
  }
  if (local_138._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x471,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  name_14._M_str = "bar_enum";
  name_14._M_len = 8;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_14);
  pEVar3 = Reflection::GetEnum(this_01,&local_108.super_Message,pFVar2);
  local_138._M_head_impl._0_4_ = pEVar3->number_;
  testing::internal::CmpHelperEQ<proto2_unittest::TestOneof2_NestedEnum,int>
            ((internal *)local_128,"unittest::TestOneof2::BAR",
             "reflection->GetEnum(message, descriptor->FindFieldByName(\"bar_enum\")) ->number()",
             &proto2_unittest::TestOneof2::BAR,(int *)&local_138);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x475,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138._M_head_impl + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  name_15._M_str = "foo_int";
  name_15._M_len = 7;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_15);
  Reflection::SetInt32(this_01,&local_108.super_Message,pFVar2,0x7b);
  local_138._M_head_impl._0_4_ = 0x7b;
  name_16._M_str = "foo_int";
  name_16._M_len = 7;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_16);
  iVar1 = Reflection::GetInt32(this_01,&local_108.super_Message,pFVar2);
  local_140.data_._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_128,"123",
             "reflection->GetInt32(message, descriptor->FindFieldByName(\"foo_int\"))",
             (int *)&local_138,(int *)&local_140);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x47a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138._M_head_impl + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  name_17._M_str = "foo_string";
  name_17._M_len = 10;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_17);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"abc","");
  Reflection::SetString(this_01,&local_108.super_Message,pFVar2,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  name_18._M_str = "foo_string";
  name_18._M_len = 10;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_18);
  Reflection::GetString_abi_cxx11_((string *)local_128,this_01,&local_108.super_Message,pFVar2);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_138,"\"abc\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"foo_string\"))",
             (char (*) [4])"abc",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1);
  }
  if (local_138._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x47e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  name_19._M_str = "foo_bytes";
  name_19._M_len = 9;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_19);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"bytes","");
  Reflection::SetString(this_01,&local_108.super_Message,pFVar2,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  name_20._M_str = "foo_bytes";
  name_20._M_len = 9;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_20);
  Reflection::GetString_abi_cxx11_((string *)local_128,this_01,&local_108.super_Message,pFVar2);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_138,"\"bytes\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"foo_bytes\"))",
             (char (*) [6])0x12af64c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1);
  }
  if (local_138._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x482,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  name_21._M_str = "foo_bytes_cord";
  name_21._M_len = 0xe;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_21);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"bytes_cord","");
  Reflection::SetString(this_01,&local_108.super_Message,pFVar2,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  name_22._M_str = "foo_bytes_cord";
  name_22._M_len = 0xe;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_22);
  Reflection::GetString_abi_cxx11_((string *)local_128,this_01,&local_108.super_Message,pFVar2);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&local_138,"\"bytes_cord\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"foo_bytes_cord\"))",
             (char (*) [11])0x112f0a2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1);
  }
  if (local_138._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x487,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  name_23._M_str = "bar_cord";
  name_23._M_len = 8;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_23);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"change_cord","");
  Reflection::SetString(this_01,&local_108.super_Message,pFVar2,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  name_24._M_str = "bar_cord";
  name_24._M_len = 8;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_24);
  Reflection::GetString_abi_cxx11_((string *)local_128,this_01,&local_108.super_Message,pFVar2);
  testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
            ((internal *)&local_138,"\"change_cord\"",
             "reflection->GetString(message, descriptor->FindFieldByName(\"bar_cord\"))",
             (char (*) [12])"change_cord",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1);
  }
  if (local_138._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x48c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  name_25._M_str = "bar_string_piece";
  name_25._M_len = 0x10;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_25);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"change_spiece","");
  Reflection::SetString(this_01,&local_108.super_Message,pFVar2,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  name_26._M_str = "bar_string_piece";
  name_26._M_len = 0x10;
  pFVar2 = Descriptor::FindFieldByName(this_00,name_26);
  Reflection::GetString_abi_cxx11_((string *)local_128,this_01,&local_108.super_Message,pFVar2);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)&local_138,"\"change_spiece\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"bar_string_piece\"))",
             (char (*) [14])"change_spiece",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1);
  }
  if (local_138._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x492,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  proto2_unittest::TestOneof2::clear_foo(&local_108);
  proto2_unittest::TestOneof2::clear_bar(&local_108);
  TestUtil::ExpectOneofClear<proto2_unittest::TestOneof2>(&local_108);
  proto2_unittest::TestOneof2::~TestOneof2(&local_108);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, Oneof) {
  unittest::TestOneof2 message;
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = message.GetReflection();

  // Check default values.
  EXPECT_EQ(
      0, reflection->GetInt32(message, descriptor->FindFieldByName("foo_int")));
  EXPECT_EQ("", reflection->GetString(
                    message, descriptor->FindFieldByName("foo_string")));
  EXPECT_EQ("", reflection->GetString(message,
                                      descriptor->FindFieldByName("foo_cord")));
  EXPECT_EQ("", reflection->GetString(
                    message, descriptor->FindFieldByName("foo_string_piece")));
  EXPECT_EQ("", reflection->GetString(
                    message, descriptor->FindFieldByName("foo_bytes")));
  EXPECT_EQ(
      unittest::TestOneof2::FOO,
      reflection->GetEnum(message, descriptor->FindFieldByName("foo_enum"))
          ->number());
  EXPECT_EQ(&unittest::TestOneof2::NestedMessage::default_instance(),
            &reflection->GetMessage(
                message, descriptor->FindFieldByName("foo_message")));
  EXPECT_EQ(&unittest::TestOneof2::FooGroup::default_instance(),
            &reflection->GetMessage(message,
                                    descriptor->FindFieldByName("foogroup")));
  EXPECT_NE(&unittest::TestOneof2::FooGroup::default_instance(),
            &reflection->GetMessage(
                message, descriptor->FindFieldByName("foo_lazy_message")));
  EXPECT_EQ("", reflection->GetString(
                    message, descriptor->FindFieldByName("foo_bytes_cord")));
  EXPECT_EQ(
      5, reflection->GetInt32(message, descriptor->FindFieldByName("bar_int")));
  EXPECT_EQ("STRING", reflection->GetString(
                          message, descriptor->FindFieldByName("bar_string")));
  EXPECT_EQ("CORD", reflection->GetString(
                        message, descriptor->FindFieldByName("bar_cord")));
  EXPECT_EQ("SPIECE",
            reflection->GetString(
                message, descriptor->FindFieldByName("bar_string_piece")));
  EXPECT_EQ("BYTES", reflection->GetString(
                         message, descriptor->FindFieldByName("bar_bytes")));
  EXPECT_EQ(
      unittest::TestOneof2::BAR,
      reflection->GetEnum(message, descriptor->FindFieldByName("bar_enum"))
          ->number());

  // Check Set functions.
  reflection->SetInt32(&message, descriptor->FindFieldByName("foo_int"), 123);
  EXPECT_EQ(123, reflection->GetInt32(message,
                                      descriptor->FindFieldByName("foo_int")));
  reflection->SetString(&message, descriptor->FindFieldByName("foo_string"),
                        "abc");
  EXPECT_EQ("abc", reflection->GetString(
                       message, descriptor->FindFieldByName("foo_string")));
  reflection->SetString(&message, descriptor->FindFieldByName("foo_bytes"),
                        "bytes");
  EXPECT_EQ("bytes", reflection->GetString(
                         message, descriptor->FindFieldByName("foo_bytes")));
  reflection->SetString(&message, descriptor->FindFieldByName("foo_bytes_cord"),
                        "bytes_cord");
  EXPECT_EQ("bytes_cord",
            reflection->GetString(
                message, descriptor->FindFieldByName("foo_bytes_cord")));
  reflection->SetString(&message, descriptor->FindFieldByName("bar_cord"),
                        "change_cord");
  EXPECT_EQ(
      "change_cord",
      reflection->GetString(message, descriptor->FindFieldByName("bar_cord")));
  reflection->SetString(&message,
                        descriptor->FindFieldByName("bar_string_piece"),
                        "change_spiece");
  EXPECT_EQ("change_spiece",
            reflection->GetString(
                message, descriptor->FindFieldByName("bar_string_piece")));

  message.clear_foo();
  message.clear_bar();
  TestUtil::ExpectOneofClear(message);
}